

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_value.cc
# Opt level: O3

void __thiscall test_apply_endian_swap::test_method(test_apply_endian_swap *this)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  PluginManager *pPVar26;
  long *plVar27;
  ulong uVar28;
  undefined1 *puVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  B *pBVar33;
  int j;
  int iVar34;
  long lVar35;
  int i;
  undefined1 auVar36 [16];
  undefined4 uVar38;
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float local_d9c;
  B *local_d98;
  float *local_d90;
  B *local_d88;
  ulong uStack_d80;
  undefined8 *local_d78;
  B **local_d70;
  string *local_d68;
  ulong uStack_d60;
  undefined8 *local_d58;
  float **local_d50;
  undefined1 local_d48 [8];
  undefined1 local_d40 [16];
  long *local_d30;
  char *local_d28;
  char *local_d20;
  undefined **local_d18;
  undefined1 local_d10;
  undefined8 *local_d08;
  char *local_d00;
  code *local_cf8;
  CompileEndianSwapVisitor compiled;
  undefined1 local_ce0 [16];
  undefined8 local_cd0;
  long local_cc8;
  B *local_cc0;
  undefined1 *local_cb8;
  undefined1 *local_cb0;
  char *local_ca8;
  char *local_ca0;
  undefined1 *local_c98;
  undefined1 *local_c90;
  char *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  undefined1 *local_c70;
  char *local_c68;
  char *local_c60;
  undefined1 *local_c58;
  undefined1 *local_c50;
  char *local_c48;
  char *local_c40;
  undefined1 *local_c38;
  undefined1 *local_c30;
  char *local_c28;
  char *local_c20;
  undefined1 *local_c18;
  undefined1 *local_c10;
  char *local_c08;
  char *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  Registry registry;
  config_set config;
  undefined **local_a90;
  uint local_a88;
  undefined1 local_a84;
  undefined2 local_a82;
  undefined8 local_a80;
  char *local_a78;
  undefined4 local_8f0;
  undefined1 local_88c [812];
  B swapped_b;
  long lVar37;
  
  Typelib::Registry::Registry(&registry);
  utilmm::singleton::wrapper<Typelib::PluginManager>::attach();
  pPVar26 = utilmm::singleton::wrapper<Typelib::PluginManager>::instance();
  local_a90 = (undefined **)&local_a80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"tlb","");
  plVar27 = (long *)Typelib::PluginManager::importer((string *)pPVar26);
  if (local_a90 != (undefined **)&local_a80) {
    operator_delete(local_a90);
  }
  utilmm::config_set::config_set(&config,(config_set *)0x0);
  local_d30 = plVar27;
  local_a90 = (undefined **)&local_a80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a90,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_cimport.tlb"
             ,"");
  (**(code **)(*plVar27 + 0x18))(plVar27,&local_a90,&config,&registry);
  if (local_a90 != (undefined **)&local_a80) {
    operator_delete(local_a90);
  }
  local_b88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_b80 = "";
  local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b88,0xf4);
  swapped_b.a.a = CONCAT71(swapped_b.a.a._1_7_,1);
  swapped_b.a.b = 0;
  swapped_b.a.c = '\0';
  swapped_b.a._13_1_ = 0;
  swapped_b.a.d = 0;
  swapped_b.c[0] = 0.0;
  swapped_b.c[1] = 0.0;
  local_a88 = local_a88 & 0xffffff00;
  local_a90 = &PTR__lazy_ostream_001852c0;
  local_a80 = &boost::unit_test::lazy_ostream::inst;
  local_a78 = 
  "no exceptions thrown by importer->load(\"/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/\" \"test_cimport.tlb\", config, registry)"
  ;
  local_ba8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_ba0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)swapped_b.c);
  local_a90 = (undefined **)0xa00000000000000;
  local_a88 = 0x14000000;
  local_a84 = 0x62;
  local_a82 = 0x3400;
  uVar28 = 0;
  auVar39 = _DAT_00171450;
  do {
    auVar41._0_8_ = uVar28 & 0xffffffff;
    auVar41._8_4_ = (int)uVar28 + 1;
    auVar41._12_4_ = 0;
    auVar46._0_4_ = (float)(SUB168(auVar41 | _DAT_00171470,0) - (double)DAT_00171470);
    auVar46._4_4_ = (float)(SUB168(auVar41 | _DAT_00171470,8) - DAT_00171470._8_8_);
    auVar46._8_8_ = 0;
    auVar41 = divps(auVar46,_DAT_00171480);
    auVar45[1] = 0;
    auVar45[0] = auVar41[8];
    auVar45[2] = auVar41[9];
    auVar45[3] = 0;
    auVar45[4] = auVar41[10];
    auVar45[5] = 0;
    auVar45[6] = auVar41[0xb];
    auVar45[7] = 0;
    auVar45[8] = auVar41[0xc];
    auVar45[9] = 0;
    auVar45[10] = auVar41[0xd];
    auVar45[0xb] = 0;
    auVar45[0xc] = auVar41[0xe];
    auVar45[0xd] = 0;
    auVar45[0xe] = auVar41[0xf];
    auVar45[0xf] = 0;
    auVar46 = pshuflw(auVar45,auVar45,0x1b);
    pshufhw(auVar46,auVar46,0x1b);
    auVar5[0xd] = 0;
    auVar5._0_13_ = auVar41._0_13_;
    auVar5[0xe] = auVar41[7];
    auVar7[0xc] = auVar41[6];
    auVar7._0_12_ = auVar41._0_12_;
    auVar7._13_2_ = auVar5._13_2_;
    auVar9[0xb] = 0;
    auVar9._0_11_ = auVar41._0_11_;
    auVar9._12_3_ = auVar7._12_3_;
    auVar11[10] = auVar41[5];
    auVar11._0_10_ = auVar41._0_10_;
    auVar11._11_4_ = auVar9._11_4_;
    auVar13[9] = 0;
    auVar13._0_9_ = auVar41._0_9_;
    auVar13._10_5_ = auVar11._10_5_;
    auVar15[8] = auVar41[4];
    auVar15._0_8_ = auVar41._0_8_;
    auVar15._9_6_ = auVar13._9_6_;
    auVar20._7_8_ = 0;
    auVar20._0_7_ = auVar15._8_7_;
    auVar23._1_8_ = SUB158(auVar20 << 0x40,7);
    auVar23[0] = auVar41[3];
    auVar23._9_6_ = 0;
    auVar24._1_10_ = SUB1510(auVar23 << 0x30,5);
    auVar24[0] = auVar41[2];
    auVar24._11_4_ = 0;
    auVar18[2] = auVar41[1];
    auVar18._0_2_ = auVar41._0_2_;
    auVar18._3_12_ = SUB1512(auVar24 << 0x20,3);
    auVar42._0_2_ = auVar41._0_2_ & 0xff;
    auVar42._2_13_ = auVar18._2_13_;
    auVar42[0xf] = 0;
    auVar41 = pshuflw(auVar42,auVar42,0x1b);
    auVar41 = pshufhw(auVar41,auVar41,0x1b);
    sVar1 = auVar41._0_2_;
    sVar2 = auVar41._2_2_;
    sVar3 = auVar41._4_2_;
    sVar4 = auVar41._6_2_;
    uVar38 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar41[6] - (0xff < sVar4),
                      CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar41[4] - (0xff < sVar3),
                               CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar41[2] - (0xff < sVar2),
                                        (0 < sVar1) * (sVar1 < 0x100) * auVar41[0] - (0xff < sVar1))
                              ));
    sVar1 = auVar41._8_2_;
    sVar2 = auVar41._10_2_;
    sVar3 = auVar41._12_2_;
    sVar4 = auVar41._14_2_;
    if (SUB164(auVar39 ^ _DAT_0016f870,4) == DAT_00171460._4_4_ &&
        SUB164(auVar39 ^ _DAT_0016f870,0) < (int)DAT_00171460) {
      *(undefined4 *)((long)&local_a80 + uVar28 * 4) = uVar38;
      *(int *)((long)&local_a80 + uVar28 * 4 + 4) =
           (int)(CONCAT17((0 < sVar4) * (sVar4 < 0x100) * auVar41[0xe] - (0xff < sVar4),
                          CONCAT16((0 < sVar3) * (sVar3 < 0x100) * auVar41[0xc] - (0xff < sVar3),
                                   CONCAT15((0 < sVar2) * (sVar2 < 0x100) * auVar41[10] -
                                            (0xff < sVar2),
                                            CONCAT14((0 < sVar1) * (sVar1 < 0x100) * auVar41[8] -
                                                     (0xff < sVar1),uVar38)))) >> 0x20);
    }
    uVar28 = uVar28 + 2;
    lVar32 = auVar39._8_8_;
    auVar39._0_8_ = auVar39._0_8_ + 2;
    auVar39._8_8_ = lVar32 + 2;
  } while (uVar28 != 10);
  puVar29 = local_88c;
  local_8f0 = 0x2842;
  iVar31 = 1;
  lVar32 = 0;
  do {
    lVar35 = 0;
    auVar36 = _DAT_00171450;
    iVar34 = iVar31;
    do {
      fVar40 = (float)(iVar34 + -1);
      fVar44 = (float)iVar34;
      uVar28 = CONCAT44(fVar44,fVar40);
      auVar39 = pshuflw(ZEXT316(0),ZEXT316(0),0x1b);
      pshufhw(ZEXT416((uint)fVar44),auVar39,0x1b);
      auVar6._8_6_ = 0;
      auVar6._0_8_ = uVar28;
      auVar6[0xe] = (char)((uint)fVar44 >> 0x18);
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar28;
      auVar8[0xc] = (char)((uint)fVar44 >> 0x10);
      auVar8._13_2_ = auVar6._13_2_;
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar28;
      auVar10._12_3_ = auVar8._12_3_;
      auVar12._8_2_ = 0;
      auVar12._0_8_ = uVar28;
      auVar12[10] = (char)((uint)fVar44 >> 8);
      auVar12._11_4_ = auVar10._11_4_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = uVar28;
      auVar14._10_5_ = auVar12._10_5_;
      auVar16[8] = SUB41(fVar44,0);
      auVar16._0_8_ = uVar28;
      auVar16._9_6_ = auVar14._9_6_;
      auVar21._7_8_ = 0;
      auVar21._0_7_ = auVar16._8_7_;
      auVar25._1_8_ = SUB158(auVar21 << 0x40,7);
      auVar25[0] = (char)((uint)fVar40 >> 0x18);
      auVar25._9_6_ = 0;
      auVar17[4] = (char)((uint)fVar40 >> 0x10);
      auVar17._0_4_ = fVar40;
      auVar17._5_10_ = SUB1510(auVar25 << 0x30,5);
      auVar22._11_4_ = 0;
      auVar22._0_11_ = auVar17._4_11_;
      auVar19[2] = (char)((uint)fVar40 >> 8);
      auVar19._0_2_ = SUB42(fVar40,0);
      auVar19._3_12_ = SUB1512(auVar22 << 0x20,3);
      auVar43._0_2_ = SUB42(fVar40,0) & 0xff;
      auVar43._2_13_ = auVar19._2_13_;
      auVar43[0xf] = 0;
      auVar39 = pshuflw(auVar39,auVar43,0x1b);
      auVar39 = pshufhw(auVar39,auVar39,0x1b);
      sVar1 = auVar39._0_2_;
      sVar2 = auVar39._2_2_;
      sVar3 = auVar39._4_2_;
      sVar4 = auVar39._6_2_;
      uVar38 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar39[6] - (0xff < sVar4),
                        CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar39[4] - (0xff < sVar3),
                                 CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar39[2] -
                                          (0xff < sVar2),
                                          (0 < sVar1) * (sVar1 < 0x100) * auVar39[0] -
                                          (0xff < sVar1))));
      sVar1 = auVar39._8_2_;
      sVar2 = auVar39._10_2_;
      sVar3 = auVar39._12_2_;
      sVar4 = auVar39._14_2_;
      if (SUB164(auVar36 ^ _DAT_0016f870,4) == DAT_00171460._4_4_ &&
          SUB164(auVar36 ^ _DAT_0016f870,0) < (int)DAT_00171460) {
        *(undefined4 *)(puVar29 + lVar35 * 4 + -4) = uVar38;
        *(int *)(puVar29 + lVar35 * 4) =
             (int)(CONCAT17((0 < sVar4) * (sVar4 < 0x100) * auVar39[0xe] - (0xff < sVar4),
                            CONCAT16((0 < sVar3) * (sVar3 < 0x100) * auVar39[0xc] - (0xff < sVar3),
                                     CONCAT15((0 < sVar2) * (sVar2 < 0x100) * auVar39[10] -
                                              (0xff < sVar2),
                                              CONCAT14((0 < sVar1) * (sVar1 < 0x100) * auVar39[8] -
                                                       (0xff < sVar1),uVar38)))) >> 0x20);
      }
      lVar35 = lVar35 + 2;
      lVar37 = auVar36._8_8_;
      auVar36._0_8_ = auVar36._0_8_ + 2;
      auVar36._8_8_ = lVar37 + 2;
      iVar34 = iVar34 + 2;
    } while (lVar35 != 10);
    lVar32 = lVar32 + 1;
    iVar31 = iVar31 + 100;
    puVar29 = puVar29 + 0x50;
  } while (lVar32 != 10);
  pBVar33 = (B *)swapped_b.c;
  swapped_b.a.a = (longlong)pBVar33;
  std::__cxx11::string::_M_construct<char_const*>((string *)&swapped_b,"/B","");
  uVar28 = Typelib::Registry::get((string *)&registry);
  if ((B *)swapped_b.a.a != pBVar33) {
    operator_delete((void *)swapped_b.a.a);
  }
  _compiled = (code *)local_ce0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&compiled,"/B","");
  uVar30 = Typelib::Registry::get((string *)&registry);
  if (_compiled != (code *)local_ce0) {
    operator_delete(_compiled);
  }
  local_cf8 = boost::test_tools::tt_detail::report_assertion;
  _compiled = boost::test_tools::tt_detail::report_assertion;
  local_ce0 = (undefined1  [16])0x0;
  local_cd0 = 0;
  Typelib::CompileEndianSwapVisitor::apply((Type *)&compiled);
  local_d88 = &swapped_b;
  uStack_d80 = uVar30;
  local_d68 = (string *)&local_a90;
  uStack_d60 = uVar28;
  Typelib::CompileEndianSwapVisitor::swap(&compiled,0,0,local_ce0._0_8_,local_ce0._8_8_);
  local_be8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_be0 = "";
  local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_be8,0x10f);
  local_d10 = 0;
  local_d18 = &PTR__lazy_ostream_001843b8;
  local_d08 = &boost::unit_test::lazy_ostream::inst;
  local_d00 = "";
  local_d90 = &local_d9c;
  local_d9c = 1.4013e-44;
  local_d48[0] = swapped_b.a.a == 10;
  local_d40 = ZEXT816(0);
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_d20 = "";
  local_d50 = &local_d90;
  uStack_d60 = uStack_d60 & 0xffffffffffffff00;
  local_d68 = (string *)&PTR__lazy_ostream_001846f8;
  local_d58 = &boost::unit_test::lazy_ostream::inst;
  local_d70 = &local_d98;
  uStack_d80 = uStack_d80 & 0xffffffffffffff00;
  local_d88 = (B *)&PTR__lazy_ostream_00185720;
  local_d78 = &boost::unit_test::lazy_ostream::inst;
  local_d98 = &swapped_b;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_d40 + 8));
  local_c08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c00 = "";
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c08,0x110);
  local_d10 = 0;
  local_d18 = &PTR__lazy_ostream_001843b8;
  local_d08 = &boost::unit_test::lazy_ostream::inst;
  local_d00 = "";
  local_d98 = (B *)&swapped_b.a.b;
  local_d48[0] = swapped_b.a.b == 0x14;
  local_d9c = 2.8026e-44;
  local_d40 = ZEXT816(0);
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_d20 = "";
  local_d90 = &local_d9c;
  uStack_d60 = uStack_d60 & 0xffffffffffffff00;
  local_d68 = (string *)&PTR__lazy_ostream_001846f8;
  local_d58 = &boost::unit_test::lazy_ostream::inst;
  local_d50 = &local_d90;
  uStack_d80 = uStack_d80 & 0xffffffffffffff00;
  local_d88 = (B *)&PTR__lazy_ostream_001846f8;
  local_d78 = &boost::unit_test::lazy_ostream::inst;
  local_d70 = &local_d98;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_d40 + 8));
  local_c28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c20 = "";
  local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c30 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c28,0x111);
  local_d10 = 0;
  local_d18 = &PTR__lazy_ostream_001843b8;
  local_d08 = &boost::unit_test::lazy_ostream::inst;
  local_d00 = "";
  local_d9c = (float)CONCAT31(local_d9c._1_3_,0x62);
  local_d98 = (B *)&swapped_b.a.c;
  local_d48[0] = swapped_b.a.c == 'b';
  local_d40 = ZEXT816(0);
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_d20 = "";
  local_d90 = &local_d9c;
  uStack_d60 = uStack_d60 & 0xffffffffffffff00;
  local_d68 = (string *)&PTR__lazy_ostream_00185760;
  local_d58 = &boost::unit_test::lazy_ostream::inst;
  local_d50 = &local_d90;
  uStack_d80 = uStack_d80 & 0xffffffffffffff00;
  local_d88 = (B *)&PTR__lazy_ostream_00185760;
  local_d78 = &boost::unit_test::lazy_ostream::inst;
  local_d70 = &local_d98;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_d40 + 8));
  local_c48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c40 = "";
  local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c48,0x112);
  local_d10 = 0;
  local_d18 = &PTR__lazy_ostream_001843b8;
  local_d08 = &boost::unit_test::lazy_ostream::inst;
  local_d00 = "";
  local_d9c = 7.28675e-44;
  local_d98 = (B *)&swapped_b.a.d;
  local_d48[0] = swapped_b.a.d == 0x34;
  local_d40 = ZEXT816(0);
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_d20 = "";
  local_d90 = &local_d9c;
  uStack_d60 = uStack_d60 & 0xffffffffffffff00;
  local_d68 = (string *)&PTR__lazy_ostream_001846f8;
  local_d58 = &boost::unit_test::lazy_ostream::inst;
  local_d50 = &local_d90;
  uStack_d80 = uStack_d80 & 0xffffffffffffff00;
  local_d88 = (B *)&PTR__lazy_ostream_001857a0;
  local_d78 = &boost::unit_test::lazy_ostream::inst;
  local_d70 = &local_d98;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_d40 + 8));
  lVar32 = 0;
  do {
    local_c88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
    ;
    local_c80 = "";
    local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c90 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c88,0x114,&local_c98);
    local_d10 = 0;
    local_d18 = &PTR__lazy_ostream_001843b8;
    local_d08 = &boost::unit_test::lazy_ostream::inst;
    local_d00 = "";
    local_d9c = (float)(int)lVar32 / 10.0;
    local_d48[0] = local_d9c == *(float *)&(pBVar33->a).a;
    local_d40._0_12_ = ZEXT812(0);
    local_d40._12_4_ = 0;
    local_d28 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
    ;
    local_d20 = "";
    local_d90 = &local_d9c;
    uStack_d60 = uStack_d60 & 0xffffffffffffff00;
    local_d68 = (string *)&PTR__lazy_ostream_00184b80;
    local_d58 = &boost::unit_test::lazy_ostream::inst;
    local_d50 = &local_d90;
    uStack_d80 = uStack_d80 & 0xffffffffffffff00;
    local_d88 = (B *)&PTR__lazy_ostream_00184b80;
    local_d78 = &boost::unit_test::lazy_ostream::inst;
    local_d70 = &local_d98;
    local_d98 = pBVar33;
    boost::test_tools::tt_detail::report_assertion
              (local_d48,&local_d18,&local_d28,0x114,2,2,2,"static_cast<float>(i) / 10.0f",
               &local_d68,"swapped_b.c[i]",&local_d88);
    boost::detail::shared_count::~shared_count((shared_count *)(local_d40 + 8));
    lVar32 = lVar32 + 1;
    pBVar33 = (B *)((long)&(pBVar33->a).a + 4);
  } while (lVar32 != 10);
  local_c68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c60 = "";
  local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c68,0x115);
  local_d10 = 0;
  local_d18 = &PTR__lazy_ostream_001843b8;
  local_d08 = &boost::unit_test::lazy_ostream::inst;
  local_d00 = "";
  local_d9c = 5.88545e-44;
  local_d98 = (B *)swapped_b.d;
  local_d48[0] = swapped_b.d[0] == 42.0;
  local_d40 = ZEXT816(0);
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_d20 = "";
  local_d90 = &local_d9c;
  uStack_d60 = uStack_d60 & 0xffffffffffffff00;
  local_d68 = (string *)&PTR__lazy_ostream_001846f8;
  local_d58 = &boost::unit_test::lazy_ostream::inst;
  local_d50 = &local_d90;
  uStack_d80 = uStack_d80 & 0xffffffffffffff00;
  local_d88 = (B *)&PTR__lazy_ostream_00184b80;
  local_d78 = &boost::unit_test::lazy_ostream::inst;
  local_d70 = &local_d98;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_d40 + 8));
  pBVar33 = (B *)swapped_b.i;
  iVar31 = 0;
  lVar32 = 0;
  do {
    lVar35 = 0;
    local_cc8 = lVar32;
    local_cc0 = pBVar33;
    do {
      local_ca8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
      ;
      local_ca0 = "";
      local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_ca8,0x118,&local_cb8)
      ;
      local_d9c = (float)(iVar31 + (int)lVar35);
      local_d48[0] = (float)(int)local_d9c == *(float *)&(pBVar33->a).a;
      local_d10 = 0;
      local_d18 = &PTR__lazy_ostream_001843b8;
      local_d08 = &boost::unit_test::lazy_ostream::inst;
      local_d00 = "";
      local_d40._0_12_ = ZEXT812(0);
      local_d40._12_4_ = 0;
      local_d28 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
      ;
      local_d20 = "";
      local_d90 = &local_d9c;
      uStack_d60 = uStack_d60 & 0xffffffffffffff00;
      local_d68 = (string *)&PTR__lazy_ostream_001846f8;
      local_d58 = &boost::unit_test::lazy_ostream::inst;
      local_d50 = &local_d90;
      uStack_d80 = uStack_d80 & 0xffffffffffffff00;
      local_d88 = (B *)&PTR__lazy_ostream_00184b80;
      local_d78 = &boost::unit_test::lazy_ostream::inst;
      local_d70 = &local_d98;
      local_d98 = pBVar33;
      boost::test_tools::tt_detail::report_assertion
                (local_d48,&local_d18,&local_d28,0x118,2,2,2,"i * 100 + j",&local_d68,
                 "swapped_b.i[i][j]",&local_d88);
      boost::detail::shared_count::~shared_count((shared_count *)(local_d40 + 8));
      lVar35 = lVar35 + 1;
      pBVar33 = (B *)((long)&(pBVar33->a).a + 4);
    } while (lVar35 != 10);
    lVar32 = local_cc8 + 1;
    iVar31 = iVar31 + 100;
    pBVar33 = (B *)(*(float (*) [20])local_cc0->c + 0x10);
  } while (lVar32 != 10);
  _compiled = local_cf8;
  if ((void *)local_ce0._0_8_ != (void *)0x0) {
    operator_delete((void *)local_ce0._0_8_);
  }
  utilmm::config_set::~config_set(&config);
  if (local_d30 != (long *)0x0) {
    (**(code **)(*local_d30 + 8))();
  }
  utilmm::singleton::wrapper<Typelib::PluginManager>::detach();
  Typelib::Registry::~Registry(&registry);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( test_apply_endian_swap )
{
    // Get the test file into repository
    Registry registry;
    PluginManager::self manager;
    unique_ptr<Importer> importer(manager->importer("tlb"));
    utilmm::config_set config;
    BOOST_REQUIRE_NO_THROW( importer->load(TEST_DATA_PATH("test_cimport.tlb"), config, registry) );

    A a = {
        Endian::swap((long long)10),
        Endian::swap((int)20),
        Endian::swap('b'),
        Endian::swap((short)52)
    };
    B b;
    b.a = a;
    for (int i = 0; i < 10; ++i)
        b.c[i] = Endian::swap(static_cast<float>(i) / 10.0f);

    b.d[0] = Endian::swap<float>(42);

    for (int i = 0; i < 10; ++i)
        for (int j = 0; j < 10; ++j)
            b.i[i][j] = Endian::swap<float>(i * 100 + j);

    Value v_b(&b, *registry.get("/B"));
    B swapped_b;
    Value v_swapped_b(&swapped_b, *registry.get("/B"));

    CompileEndianSwapVisitor compiled;
    compiled.apply(v_b.getType());
    compiled.swap(v_b, v_swapped_b);

    BOOST_REQUIRE_EQUAL(10, swapped_b.a.a);
    BOOST_REQUIRE_EQUAL(20, swapped_b.a.b);
    BOOST_REQUIRE_EQUAL('b', swapped_b.a.c);
    BOOST_REQUIRE_EQUAL(52, swapped_b.a.d);
    for (int i = 0; i < 10; ++i)
        BOOST_REQUIRE_EQUAL(static_cast<float>(i) / 10.0f, swapped_b.c[i]);
    BOOST_REQUIRE_EQUAL(42, swapped_b.d[0]);
    for (int i = 0; i < 10; ++i)
        for (int j = 0; j < 10; ++j)
            BOOST_REQUIRE_EQUAL(i * 100 + j, swapped_b.i[i][j]);
}